

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_set_ignore_case
          (App *this,string *name,string *member,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,string *description,bool defaulted)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  Option *pOVar4;
  long *plVar5;
  undefined8 uVar6;
  string *description_00;
  long *plVar7;
  undefined1 *unaff_R15;
  string simple_name;
  callback_t fun;
  string typeval;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  _Any_data local_188;
  code *local_178;
  _Any_data local_168;
  code *local_158;
  undefined1 local_148 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  _Alloc_hider local_110;
  char local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148,name,',');
  if ((undefined1  [8])local_140._M_impl._0_8_ == local_148) {
    uVar6 = ::std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    if (local_f0[0] != unaff_R15) {
      operator_delete(local_f0[0]);
    }
    if (local_148 != (undefined1  [8])local_148) {
      operator_delete((void *)local_148);
    }
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    _Unwind_Resume(uVar6);
  }
  local_1c8 = local_1b8;
  pbVar2 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148)->_M_impl).super__Vector_impl_data._M_start;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pbVar2,
             (long)&((*(pointer *)((long)local_148 + 8))->_M_dataplus)._M_p + (long)pbVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  local_148 = (undefined1  [8])member;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&local_140,&options->_M_t);
  local_110._M_p = local_100;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_1c8,local_1c8 + local_1c0);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_set_ignore_case(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string,bool)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_168._M_pod_data,(anon_class_88_3_1d669d6f *)local_148);
  if (local_110._M_p != local_100) {
    operator_delete(local_110._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_140);
  pcVar3 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + name->_M_string_length);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_188,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_168);
  pcVar3 = (description->_M_dataplus)._M_p;
  local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b0 + 0x20),pcVar3,pcVar3 + description->_M_string_length);
  description_00 = (string *)(local_b0 + 0x20);
  pOVar4 = add_option(this,&local_70,(callback_t *)&local_188,description_00,defaulted);
  if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  p_Var1 = &local_140._M_impl.super__Rb_tree_header;
  local_148 = (undefined1  [8])p_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"TEXT","");
  local_b0._0_8_ = local_b0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,",","");
  detail::
  join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (&local_50,(detail *)options,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,description_00);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1749a0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_198 = *plVar7;
    lStack_190 = plVar5[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar7;
    local_1a8 = (long *)*plVar5;
  }
  local_1a0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1a8);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1d8 = *plVar7;
    lStack_1d0 = plVar5[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar7;
    local_1e8 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::_M_append(local_148,(ulong)local_1e8);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  local_d0[0] = local_c0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,local_148,
             (undefined1 *)
             ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_140._M_impl._0_8_)->_M_impl).super__Vector_impl_data._M_start +
             (long)&((_Rb_tree_node_base *)local_148)->_M_color));
  ::std::__cxx11::string::_M_assign((string *)&pOVar4->typeval_);
  pOVar4->expected_ = 1;
  pOVar4->changeable_ = false;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if (defaulted) {
    pcVar3 = (member->_M_dataplus)._M_p;
    local_f0[0] = local_e0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,pcVar3,pcVar3 + member->_M_string_length);
    ::std::__cxx11::string::_M_assign((string *)&pOVar4->defaultval_);
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
  }
  if (local_148 != (undefined1  [8])p_Var1) {
    operator_delete((void *)local_148);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  return pOVar4;
}

Assistant:

Option *add_set_ignore_case(std::string name,
                                std::string &member,           ///< The selected member of the set
                                std::set<std::string> options, ///< The set of posibilities
                                std::string description,
                                bool defaulted) {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            member = detail::to_lower(res[0]);
            auto iter = std::find_if(std::begin(options), std::end(options), [&member](std::string val) {
                return detail::to_lower(val) == member;
            });
            if(iter == std::end(options))
                throw ConversionError(member, simple_name);
            else {
                member = *iter;
                return true;
            }
        };

        Option *opt = add_option(name, fun, description, defaulted);
        std::string typeval = detail::type_name<std::string>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        if(defaulted) {
            opt->set_default_str(member);
        }
        return opt;
    }